

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::GetDefiningBlocks(LCSSARewriter *this,uint32_t bb_id)

{
  _Hash_node_base this_00;
  DominatorTree *this_01;
  uint32_t *puVar1;
  uint *puVar2;
  bool bVar3;
  uint32_t a;
  BasicBlock *pBVar4;
  mapped_type *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  uint *puVar6;
  long lVar7;
  uint uVar8;
  pointer puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  __node_base *p_Var13;
  uint32_t *puVar14;
  uint32_t bb_id_local;
  uint32_t pred_id;
  uint32_t local_2c;
  
  bb_id_local = bb_id;
  pBVar4 = CFG::block(this->cfg_,bb_id);
  if (pBVar4 == (BasicBlock *)0x0) {
    __assert_fail("cfg_->block(bb_id) != nullptr && \"Unknown basic block\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                  ,0xdb,
                  "const std::vector<uint32_t> &spvtools::opt::(anonymous namespace)::LCSSARewriter::GetDefiningBlocks(uint32_t)"
                 );
  }
  this_02 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->bb_to_defining_blocks_,&bb_id_local);
  if ((this_02->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (this_02->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    return this_02;
  }
  p_Var13 = &(this->exit_bb_->_M_h)._M_before_begin;
  while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
    this_00._M_nxt = p_Var13[1]._M_nxt;
    this_01 = this->dom_tree_;
    a = BasicBlock::id((BasicBlock *)this_00._M_nxt);
    bVar3 = DominatorTree::Dominates(this_01,a,bb_id_local);
    if (bVar3) {
      local_2c = BasicBlock::id((BasicBlock *)this_00._M_nxt);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (this_02,&local_2c);
      return this_02;
    }
  }
  pvVar5 = CFG::preds(this->cfg_,bb_id_local);
  puVar1 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar14 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start; puVar14 != puVar1; puVar14 = puVar14 + 1) {
    pred_id = *puVar14;
    pvVar5 = GetDefiningBlocks(this,pred_id);
    puVar9 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar9 != 4) {
      puVar9 = &pred_id;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_02,puVar9);
  }
  puVar9 = (this_02->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this_02->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar10 = (long)puVar2 - (long)puVar9;
  if (lVar10 == 0) {
    __assert_fail("defining_blocks.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                  ,0xf2,
                  "const std::vector<uint32_t> &spvtools::opt::(anonymous namespace)::LCSSARewriter::GetDefiningBlocks(uint32_t)"
                 );
  }
  lVar12 = 0xc;
  lVar7 = 0;
  for (lVar11 = lVar10 >> 4; 0 < lVar11; lVar11 = lVar11 + -1) {
    uVar8 = *(uint *)((long)puVar9 + lVar12 + -0xc);
    if (*puVar9 != uVar8) {
      puVar6 = (uint *)((long)puVar9 - lVar7);
      goto LAB_005192f3;
    }
    if (uVar8 != *(uint *)((long)puVar9 + lVar12 + -8)) {
      puVar6 = (uint *)((long)puVar9 + (4 - lVar7));
      goto LAB_005192f3;
    }
    if (uVar8 != *(uint *)((long)puVar9 + lVar12 + -4)) {
      puVar6 = (uint *)((long)puVar9 + (8 - lVar7));
      goto LAB_005192f3;
    }
    if (uVar8 != *(uint *)((long)puVar9 + lVar12)) {
      puVar6 = (uint *)((long)puVar9 + (0xc - lVar7));
      goto LAB_005192f3;
    }
    lVar7 = lVar7 + -0x10;
    lVar12 = lVar12 + 0x10;
  }
  lVar10 = lVar10 + lVar7 >> 2;
  puVar6 = (uint *)((long)puVar9 - lVar7);
  if (lVar10 == 3) {
    uVar8 = *(uint *)((long)puVar9 + lVar12 + -0xc);
    if (*puVar9 == uVar8) {
      puVar6 = (uint *)((long)puVar9 + (4 - lVar7));
      goto LAB_0051932b;
    }
  }
  else {
    if (lVar10 == 2) {
      uVar8 = *puVar9;
LAB_0051932b:
      if (uVar8 != *puVar6) goto LAB_005192f3;
      puVar6 = puVar6 + 1;
    }
    else {
      if (lVar10 != 1) goto LAB_005192f8;
      uVar8 = *puVar9;
    }
    if (uVar8 == *puVar6) {
      puVar6 = puVar2;
    }
  }
LAB_005192f3:
  if (puVar6 != puVar2) {
    return this_02;
  }
LAB_005192f8:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_02,1);
  return this_02;
}

Assistant:

const std::vector<uint32_t>& GetDefiningBlocks(uint32_t bb_id) {
    assert(cfg_->block(bb_id) != nullptr && "Unknown basic block");
    std::vector<uint32_t>& defining_blocks = bb_to_defining_blocks_[bb_id];

    if (defining_blocks.size()) return defining_blocks;

    // Check if one of the loop exit basic block dominates |bb_id|.
    for (const BasicBlock* e_bb : exit_bb_) {
      if (dom_tree_.Dominates(e_bb->id(), bb_id)) {
        defining_blocks.push_back(e_bb->id());
        return defining_blocks;
      }
    }

    // Process parents, they will returns their suitable blocks.
    // If they are all the same, this means this basic block is dominated by a
    // common block, so we won't need to build a phi instruction.
    for (uint32_t pred_id : cfg_->preds(bb_id)) {
      const std::vector<uint32_t>& pred_blocks = GetDefiningBlocks(pred_id);
      if (pred_blocks.size() == 1)
        defining_blocks.push_back(pred_blocks[0]);
      else
        defining_blocks.push_back(pred_id);
    }
    assert(defining_blocks.size());
    if (std::all_of(defining_blocks.begin(), defining_blocks.end(),
                    [&defining_blocks](uint32_t id) {
                      return id == defining_blocks[0];
                    })) {
      // No need for a phi.
      defining_blocks.resize(1);
    }

    return defining_blocks;
  }